

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O2

QStringList * __thiscall
QAccessibleToolButton::actionNames(QStringList *__return_storage_ptr__,QAccessibleToolButton *this)

{
  ToolButtonPopupMode TVar1;
  QWidget *pQVar2;
  QToolButton *pQVar3;
  QMenu *pQVar4;
  QString *args;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar2 = QAccessibleWidget::widget((QAccessibleWidget *)this);
  if ((pQVar2->data->widget_attributes & 1) == 0) {
    pQVar3 = toolButton(this);
    pQVar4 = QToolButton::menu(pQVar3);
    if (pQVar4 != (QMenu *)0x0) {
      args = (QString *)QAccessibleActionInterface::showMenuAction();
      QList<QString>::emplaceBack<QString_const&>(__return_storage_ptr__,args);
    }
    pQVar3 = toolButton(this);
    TVar1 = QToolButton::popupMode(pQVar3);
    if (TVar1 != InstantPopup) {
      QAccessibleButton::actionNames((QStringList *)&QStack_38,&this->super_QAccessibleButton);
      QList<QString>::append(__return_storage_ptr__,(QList<QString> *)&QStack_38);
      QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QAccessibleToolButton::actionNames() const
{
    QStringList names;
    if (widget()->isEnabled()) {
#if QT_CONFIG(menu)
        if (toolButton()->menu())
            names << showMenuAction();
        if (toolButton()->popupMode() != QToolButton::InstantPopup)
            names << QAccessibleButton::actionNames();
#endif
    }
    return names;
}